

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

Properties * __thiscall
libDAI::Properties::GetAs<libDAI::Properties>(Properties *this,PropertyKey *key)

{
  Properties *in_RDI;
  bad_any_cast *anon_var_0;
  PropertyKey *in_stack_ffffffffffffff88;
  Properties *in_stack_ffffffffffffff90;
  any *in_stack_ffffffffffffff98;
  
  Get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  boost::any_cast<libDAI::Properties>(in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

ValueType GetAs(const PropertyKey &key) const {
                try {
                    return boost::any_cast<ValueType>(Get(key));
                } catch( const boost::bad_any_cast & ) {
                    std::cerr << "Cannot cast property " << key << " to ";
                    std::cerr << typeid(ValueType).name() << std::endl;
                    return boost::any_cast<ValueType>(Get(key));
                }
            }